

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunchReporter.cxx
# Opt level: O1

void __thiscall cmCTestLaunchReporter::WriteXMLLabels(cmCTestLaunchReporter *this,cmXMLElement *e2)

{
  cmXMLElement this_00;
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  char *__end;
  cmXMLElement e3;
  cmXMLElement local_58;
  string local_50;
  
  LoadLabels(this);
  if ((this->Labels)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    cmXMLWriter::Comment(e2->xmlwr,"Interested parties");
    cmXMLElement::cmXMLElement(&local_58,e2,"Labels");
    p_Var1 = (this->Labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var2 = &(this->Labels)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var1 != p_Var2) {
      do {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Label","");
        this_00.xmlwr = local_58.xmlwr;
        cmXMLWriter::StartElement(local_58.xmlwr,&local_50);
        cmXMLWriter::Content<std::__cxx11::string>
                  (this_00.xmlwr,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var1 + 1)
                  );
        cmXMLWriter::EndElement(this_00.xmlwr);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
      } while ((_Rb_tree_header *)p_Var1 != p_Var2);
    }
    cmXMLWriter::EndElement(local_58.xmlwr);
  }
  return;
}

Assistant:

void cmCTestLaunchReporter::WriteXMLLabels(cmXMLElement& e2)
{
  this->LoadLabels();
  if (!this->Labels.empty()) {
    e2.Comment("Interested parties");
    cmXMLElement e3(e2, "Labels");
    for (std::string const& label : this->Labels) {
      e3.Element("Label", label);
    }
  }
}